

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void whereApplyPartialIndexConstraints(Expr *pTruth,int iTabCur,WhereClause *pWC)

{
  int iVar1;
  int iVar2;
  u16 *puVar3;
  
  for (; pTruth->op == ','; pTruth = pTruth->pRight) {
    whereApplyPartialIndexConstraints(pTruth->pLeft,iTabCur,pWC);
  }
  puVar3 = &pWC->a->wtFlags;
  for (iVar2 = 0; iVar2 < pWC->nTerm; iVar2 = iVar2 + 1) {
    if ((*puVar3 & 4) == 0) {
      iVar1 = sqlite3ExprCompare((Parse *)0x0,((WhereTerm *)(puVar3 + -9))->pExpr,pTruth,iTabCur);
      if (iVar1 == 0) {
        *(byte *)puVar3 = (byte)*puVar3 | 4;
      }
    }
    puVar3 = puVar3 + 0x1c;
  }
  return;
}

Assistant:

static void whereApplyPartialIndexConstraints(
  Expr *pTruth,
  int iTabCur,
  WhereClause *pWC
){
  int i;
  WhereTerm *pTerm;
  while( pTruth->op==TK_AND ){
    whereApplyPartialIndexConstraints(pTruth->pLeft, iTabCur, pWC);
    pTruth = pTruth->pRight;
  }
  for(i=0, pTerm=pWC->a; i<pWC->nTerm; i++, pTerm++){
    Expr *pExpr;
    if( pTerm->wtFlags & TERM_CODED ) continue;
    pExpr = pTerm->pExpr;
    if( sqlite3ExprCompare(0, pExpr, pTruth, iTabCur)==0 ){
      pTerm->wtFlags |= TERM_CODED;
    }
  }
}